

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysAllocService.cpp
# Opt level: O2

void * anon_unknown.dwarf_52656a::cali_realloc_wrapper(void *ptr,size_t size)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  void *ptr_00;
  int *piVar4;
  Channel *pCVar5;
  size_t size_local;
  Caliper c;
  
  size_local = size;
  pcVar3 = (code *)gotcha_get_wrappee((anonymous_namespace)::orig_realloc_handle);
  for (pCVar5 = (Channel *)&(anonymous_namespace)::sysalloc_channels;
      pCVar5 = *(Channel **)
                &(pCVar5->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>,
      pCVar5 != (Channel *)0x0; pCVar5 = pCVar5 + 1) {
    cali::Caliper::sigsafe_instance();
    bVar2 = cali::Caliper::operator_cast_to_bool(&c);
    if (bVar2) {
      bVar2 = cali::Channel::is_active(pCVar5);
      if (bVar2) {
        cali::Caliper::memory_region_end
                  (&c,(pCVar5->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,ptr);
      }
    }
  }
  ptr_00 = (void *)(*pcVar3)(ptr,size);
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  for (pCVar5 = (Channel *)&(anonymous_namespace)::sysalloc_channels;
      pCVar5 = *(Channel **)
                &(pCVar5->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>,
      pCVar5 != (Channel *)0x0; pCVar5 = pCVar5 + 1) {
    cali::Caliper::sigsafe_instance();
    bVar2 = cali::Caliper::operator_cast_to_bool(&c);
    if (bVar2) {
      bVar2 = cali::Channel::is_active(pCVar5);
      if (bVar2) {
        cali::Caliper::memory_region_begin
                  (&c,(pCVar5->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,ptr_00,"realloc",1,1,&size_local,0,(Attribute *)0x0,(Variant *)0x0);
      }
    }
  }
  *piVar4 = iVar1;
  return ptr_00;
}

Assistant:

void* cali_realloc_wrapper(void* ptr, size_t size)
{
    decltype(&std::realloc) orig_realloc =
        reinterpret_cast<decltype(&std::realloc)>(gotcha_get_wrappee(orig_realloc_handle));

    for (ChannelList* p = sysalloc_channels; p; p = p->next) {
        Caliper c = Caliper::sigsafe_instance();

        if (c && p->channel.is_active())
            c.memory_region_end(p->channel.body(), ptr);
    }

    void* ret = (*orig_realloc)(ptr, size);

    int saved_errno = errno;

    for (ChannelList* p = sysalloc_channels; p; p = p->next) {
        Caliper c = Caliper::sigsafe_instance();

        if (c && p->channel.is_active())
            c.memory_region_begin(p->channel.body(), ret, "realloc", 1, 1, &size);
    }

    errno = saved_errno;

    return ret;
}